

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_ImTextureID_resizeT(ImVector_ImTextureID *self,int new_size,ImTextureID v)

{
  int iVar1;
  void **__dest;
  long lVar2;
  int iVar3;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    if (iVar3 <= new_size) {
      iVar3 = new_size;
    }
    if (iVar1 < iVar3) {
      __dest = (void **)ImGui::MemAlloc((long)iVar3 << 3);
      if (self->Data != (void **)0x0) {
        memcpy(__dest,self->Data,(long)self->Size << 3);
        ImGui::MemFree(self->Data);
      }
      self->Data = __dest;
      self->Capacity = iVar3;
    }
  }
  lVar2 = (long)self->Size;
  if (self->Size < new_size) {
    do {
      self->Data[lVar2] = v;
      lVar2 = lVar2 + 1;
    } while (new_size != lVar2);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImTextureID_resizeT(ImVector_ImTextureID* self,int new_size,const ImTextureID v)
{
    return self->resize(new_size,v);
}